

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * __thiscall
httplib::detail::make_content_range_header_field_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,size_t offset,size_t length,
          size_t content_length)

{
  string local_a0;
  string local_80;
  string local_60;
  allocator<char> local_2a;
  undefined1 local_29;
  size_t local_28;
  size_t content_length_local;
  size_t length_local;
  size_t offset_local;
  string *field;
  
  local_29 = 0;
  local_28 = length;
  content_length_local = offset;
  length_local = (size_t)this;
  offset_local = (size_t)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"bytes ",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  std::__cxx11::to_string(&local_60,length_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-");
  std::__cxx11::to_string(&local_80,(length_local - 1) + content_length_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  std::__cxx11::to_string(&local_a0,local_28);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_content_range_header_field(size_t offset, size_t length,
														   size_t content_length) {
			std::string field = "bytes ";
			field += std::to_string(offset);
			field += "-";
			field += std::to_string(offset + length - 1);
			field += "/";
			field += std::to_string(content_length);
			return field;
		}